

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O0

int __thiscall re2c::Node::init(Node *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  pointer ppVar3;
  mapped_type *pmVar4;
  mapped_type *this_00;
  vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
  *in_RCX;
  long in_RDX;
  pair<unsigned_int,_unsigned_int> local_5c;
  uint local_54;
  int local_50;
  uint32_t c_1;
  uint32_t step;
  uint32_t ub;
  Node *n;
  const_iterator e;
  const_iterator i;
  uint32_t lb;
  vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
  *a_local;
  RuleOp *r_local;
  bool c_local;
  Node *this_local;
  
  if (in_RDX != 0) {
    (this->rule).rank.value = *(uint32_t *)(in_RDX + 0x40);
    iVar2 = (**(code **)(**(long **)(in_RDX + 0x38) + 0x20))();
    (this->rule).restorectx = iVar2 != 0;
  }
  this->ctx = (bool)((byte)ctx & 1);
  i._M_current._4_4_ = 0;
  e = std::
      vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
      ::begin(in_RCX);
  n = (Node *)std::
              vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>
              ::end(in_RCX);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&e,(__normal_iterator<const_std::pair<re2c::Node_*,_unsigned_int>_*,_std::vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>_>
                           *)&n);
    if (!bVar1) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<re2c::Node_*,_unsigned_int>_*,_std::vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>_>
             ::operator->(&e);
    _step = ppVar3->first;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<re2c::Node_*,_unsigned_int>_*,_std::vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>_>
             ::operator->(&e);
    c_1 = ppVar3->second - 1;
    local_50 = (c_1 - i._M_current._4_4_ >> 8) + 1;
    for (local_54 = i._M_current._4_4_; local_54 < c_1; local_54 = local_50 + local_54) {
      pmVar4 = std::
               map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->arcs,(key_type *)&step);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar4,&local_54);
    }
    pmVar4 = std::
             map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->arcs,(key_type *)&step);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar4,&c_1);
    this_00 = std::
              map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
              ::operator[](&this->arcsets,(key_type *)&step);
    local_5c = std::make_pair<unsigned_int&,unsigned_int_const&>
                         ((uint *)((long)&i._M_current + 4),&c_1);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back(this_00,&local_5c);
    i._M_current._4_4_ = c_1 + 1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<re2c::Node_*,_unsigned_int>_*,_std::vector<std::pair<re2c::Node_*,_unsigned_int>,_std::allocator<std::pair<re2c::Node_*,_unsigned_int>_>_>_>
    ::operator++(&e);
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void Node::init(bool c, RuleOp *r, const std::vector<std::pair<Node*, uint32_t> > &a)
{
	if (r)
	{
		rule.rank = r->rank;
		rule.restorectx = r->ctx->fixedLength () != 0;
	}

	ctx = c;

	uint32_t lb = 0;
	std::vector<std::pair<Node*, uint32_t> >::const_iterator
		i = a.begin(),
		e = a.end();
	for (; i != e; ++i)
	{
		Node *n = i->first;
		const uint32_t ub = i->second - 1;

		// pick at most 0x100 unique edges from this range
		// (for 1-byte code units this covers the whole range: [0 - 0xFF])
		//   - range bounds must be included
		//   - values should be evenly distributed
		//   - values should be deterministic
		const uint32_t step = 1 + (ub - lb) / 0x100;
		for (uint32_t c = lb; c < ub; c += step)
		{
			arcs[n].push_back (c);
		}
		arcs[n].push_back (ub);

		arcsets[n].push_back (std::make_pair (lb, ub));
		lb = ub + 1;
	}
}